

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlCleanSpecialAttr(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
    xmlHashScanFull(ctxt->attsSpecial,xmlCleanSpecialAttrCallback,ctxt);
    iVar1 = xmlHashSize(ctxt->attsSpecial);
    if (iVar1 == 0) {
      xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
      ctxt->attsSpecial = (xmlHashTablePtr)0x0;
    }
  }
  return;
}

Assistant:

static void
xmlCleanSpecialAttr(xmlParserCtxtPtr ctxt)
{
    if (ctxt->attsSpecial == NULL)
        return;

    xmlHashScanFull(ctxt->attsSpecial, xmlCleanSpecialAttrCallback, ctxt);

    if (xmlHashSize(ctxt->attsSpecial) == 0) {
        xmlHashFree(ctxt->attsSpecial, NULL);
        ctxt->attsSpecial = NULL;
    }
}